

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O2

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
          (VerifierTemplate<false> *this,uint8_t *vec,size_t elem_size,size_t *end)

{
  bool bVar1;
  ulong elem;
  ulong uVar2;
  
  elem = (long)vec - (long)this->buf_;
  bVar1 = Verify<unsigned_int>(this,elem);
  if (bVar1) {
    bVar1 = false;
    if ((ulong)*(uint *)vec < (this->opts_).max_size / elem_size) {
      uVar2 = *(uint *)vec * elem_size + 4;
      if (end != (size_t *)0x0) {
        *end = uVar2 + elem;
      }
      bVar1 = elem <= this->size_ - uVar2 && uVar2 < this->size_;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VerifyVectorOrString(const uint8_t *const vec, const size_t elem_size,
                            size_t *const end = nullptr) const {
    const auto vec_offset = static_cast<size_t>(vec - buf_);
    // Check we can read the size field.
    if (!Verify<LenT>(vec_offset)) return false;
    // Check the whole array. If this is a string, the byte past the array must
    // be 0.
    const LenT size = ReadScalar<LenT>(vec);
    const auto max_elems = opts_.max_size / elem_size;
    if (!Check(size < max_elems))
      return false;  // Protect against byte_size overflowing.
    const auto byte_size = sizeof(LenT) + elem_size * size;
    if (end) *end = vec_offset + byte_size;
    return Verify(vec_offset, byte_size);
  }